

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

factor * __thiscall merlin::factor::binaryOpIP<merlin::factor::binOpPlus>(factor *this,long B)

{
  variable_set *this_00;
  pointer pdVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  subindex s2;
  variable_set v;
  factor local_c0;
  variable_set local_60;
  
  this_00 = &this->v_;
  variable_set::operator+(&local_60,this_00,(variable_set *)(B + 8));
  bVar2 = variable_set::operator!=(&local_60,this_00);
  if (bVar2) {
    binaryOp<merlin::factor::binOpPlus>(&local_c0,this,B);
    operator=(this,&local_c0);
    ~factor(&local_c0);
  }
  else {
    subindex::subindex((subindex *)&local_c0,this_00,(variable_set *)(B + 8));
    for (uVar3 = 0;
        pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
        uVar3 = uVar3 + 1) {
      pdVar1[uVar3] =
           *(double *)(*(long *)(B + 0x40) + (long)local_c0._vptr_factor * 8) + pdVar1[uVar3];
      subindex::operator++((subindex *)&local_c0);
    }
    subindex::~subindex((subindex *)&local_c0);
  }
  variable_set::~variable_set(&local_60);
  return this;
}

Assistant:

factor& binaryOpIP(const factor& B,
			Function Op) {
		variable_set v = v_ + B.v_;  							// expand scope to union
		if (v != v_)
			*this = binaryOp(B, Op); // if A's scope is too small, call binary op
		else {
			subindex s2(v_, B.v_);       		// otherwise create index over B
			for (size_t i = 0; i < num_states(); ++i, ++s2)
				Op.IP(t_[i], B[s2]);	// and do the operations
		}
		return *this;
	}